

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::find_or_prepare_insert_non_soo<std::basic_string_view<char,std::char_traits<char>>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  size_t __n;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 uVar24;
  bool bVar25;
  ushort uVar26;
  int iVar27;
  uint64_t uVar28;
  size_t sVar29;
  PolicyFunctions *pPVar30;
  ctrl_t *pcVar31;
  long lVar32;
  bool bVar33;
  PolicyFunctions *policy;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  CommonFields *common;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  FindInfo target;
  __m128i match;
  ulong local_a8;
  char cVar37;
  char cVar40;
  char cVar41;
  char cVar42;
  
  uVar2 = key->_M_len;
  uVar28 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,key->_M_str,uVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar36 = (uVar28 ^ uVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 | (uVar36 & 0xff0000000000) >> 0x18
            | (uVar36 & 0xff00000000) >> 8 | (uVar36 & 0xff000000) << 8 |
            (uVar36 & 0xff0000) << 0x18 | (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
  uVar2 = *(ulong *)(this + 0x10);
  uVar34 = ((ulong)common >> 7 ^ uVar2 >> 0xc) & uVar3;
  uVar24 = (undefined1)(uVar36 >> 0x38);
  auVar38 = ZEXT216(CONCAT11(uVar24,uVar24) & 0x7f7f);
  auVar38 = pshuflw(auVar38,auVar38,0);
  pcVar31 = (__return_storage_ptr__->first).ctrl_;
  pPVar30 = (PolicyFunctions *)(__return_storage_ptr__->first).field_1.slot_;
  bVar33 = __return_storage_ptr__->second;
  local_a8 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar34);
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    cVar37 = auVar38[0];
    auVar39[0] = -(cVar37 == cVar8);
    cVar40 = auVar38[1];
    auVar39[1] = -(cVar40 == cVar9);
    cVar41 = auVar38[2];
    auVar39[2] = -(cVar41 == cVar10);
    cVar42 = auVar38[3];
    auVar39[3] = -(cVar42 == cVar11);
    auVar39[4] = -(cVar37 == cVar12);
    auVar39[5] = -(cVar40 == cVar13);
    auVar39[6] = -(cVar41 == cVar14);
    auVar39[7] = -(cVar42 == cVar15);
    auVar39[8] = -(cVar37 == cVar16);
    auVar39[9] = -(cVar40 == cVar17);
    auVar39[10] = -(cVar41 == cVar18);
    auVar39[0xb] = -(cVar42 == cVar19);
    auVar39[0xc] = -(cVar37 == cVar20);
    auVar39[0xd] = -(cVar40 == cVar21);
    auVar39[0xe] = -(cVar41 == cVar22);
    auVar39[0xf] = -(cVar42 == cVar23);
    uVar26 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf;
    uVar35 = (uint)uVar26;
    if (uVar26 != 0) {
      lVar4 = *(long *)(this + 0x18);
      sVar5 = key->_M_len;
      pcVar1 = key->_M_str;
      do {
        uVar6 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar36 = uVar6 + uVar34 & uVar3;
        lVar32 = uVar36 * 0x20;
        __n = *(size_t *)(lVar4 + 8 + lVar32);
        if ((__n == sVar5) &&
           ((__n == 0 || (iVar27 = bcmp(*(void **)(lVar4 + lVar32),pcVar1,__n), iVar27 == 0)))) {
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)pPVar30;
          __return_storage_ptr__->second = bVar33;
          (__return_storage_ptr__->first).ctrl_ = pcVar31;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar36);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar4 + lVar32);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_00e470ca;
        }
        uVar26 = (ushort)(uVar35 - 1) & (ushort)uVar35;
        uVar35 = CONCAT22((short)(uVar35 - 1 >> 0x10),uVar26);
      } while (uVar26 != 0);
    }
    auVar43[0] = -(cVar8 == -0x80);
    auVar43[1] = -(cVar9 == -0x80);
    auVar43[2] = -(cVar10 == -0x80);
    auVar43[3] = -(cVar11 == -0x80);
    auVar43[4] = -(cVar12 == -0x80);
    auVar43[5] = -(cVar13 == -0x80);
    auVar43[6] = -(cVar14 == -0x80);
    auVar43[7] = -(cVar15 == -0x80);
    auVar43[8] = -(cVar16 == -0x80);
    auVar43[9] = -(cVar17 == -0x80);
    auVar43[10] = -(cVar18 == -0x80);
    auVar43[0xb] = -(cVar19 == -0x80);
    auVar43[0xc] = -(cVar20 == -0x80);
    auVar43[0xd] = -(cVar21 == -0x80);
    auVar43[0xe] = -(cVar22 == -0x80);
    auVar43[0xf] = -(cVar23 == -0x80);
    uVar26 = (ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe | (ushort)(auVar43[0xf] >> 7) << 0xf;
    if (uVar26 == 0) {
      if (*(ulong *)this < local_a8 + 0x10) {
        (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)pPVar30;
        __return_storage_ptr__->second = bVar33;
        (__return_storage_ptr__->first).ctrl_ = pcVar31;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, K = std::basic_string_view<char>]"
                     );
      }
      uVar34 = uVar34 + local_a8 + 0x10 & uVar3;
      local_a8 = local_a8 + 0x10;
    }
    else {
      policy = pPVar30;
      bVar25 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar25) {
        uVar7 = 0xf;
        if (uVar26 != 0) {
          for (; uVar26 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar35 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar35 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_a8;
      sVar29 = PrepareInsertNonSoo((container_internal *)this,common,uVar35 + uVar34 & uVar3,target,
                                   policy);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)pPVar30;
        __return_storage_ptr__->second = bVar33;
        (__return_storage_ptr__->first).ctrl_ = pcVar31;
LAB_00e470ca:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
                     );
      }
      pcVar31 = (ctrl_t *)(*(long *)(this + 0x10) + sVar29);
      pPVar30 = (PolicyFunctions *)(sVar29 * 0x20 + *(long *)(this + 0x18));
      bVar33 = true;
    }
    if (uVar26 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)pPVar30;
      __return_storage_ptr__->second = bVar33;
      (__return_storage_ptr__->first).ctrl_ = pcVar31;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }